

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String __thiscall
testing::internal::StreamableToString<long_long>(internal *this,longlong *streamable)

{
  size_t extraout_RDX;
  String SVar1;
  Message local_20;
  longlong *local_18;
  longlong *streamable_local;
  
  local_18 = streamable;
  streamable_local = (longlong *)this;
  Message::Message(&local_20);
  Message::operator<<(&local_20,local_18);
  Message::GetString((Message *)this);
  Message::~Message(&local_20);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}